

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

BOOL dwr_init(dw_rom *rom,char *input_file,char *flags)

{
  uint8_t *puVar1;
  FILE *__stream;
  size_t sVar2;
  int read;
  FILE *input;
  char *flags_local;
  char *input_file_local;
  dw_rom *rom_local;
  
  puVar1 = (uint8_t *)malloc(0x14010);
  rom->header = puVar1;
  memset(rom->header,0xff,0x14010);
  puVar1 = (uint8_t *)malloc(0x10000);
  rom->expansion = puVar1;
  memset(rom->expansion,0xff,0x10000);
  __stream = fopen(input_file,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Unable to open ROM file \'%s\'",input_file);
    rom_local._4_4_ = FALSE;
  }
  else {
    sVar2 = fread(rom->header,1,0x14010,__stream);
    if ((int)sVar2 < 0x14010) {
      fprintf(_stderr,"File \'%s\' is too small and may be corrupt, aborting.",input_file);
      fclose(__stream);
      rom_local._4_4_ = FALSE;
    }
    else {
      fclose(__stream);
      rom->content = rom->header + 0x10;
      strncpy((char *)rom->flags_encoded,flags,0x18);
      rom->flags_encoded[0x18] = '\0';
      (rom->map).flags = rom->flags;
      memset(rom->flags,0,0xf);
      base32_decode(rom->flags_encoded,rom->flags);
      update_flags(rom);
      (rom->map).chest_access = rom->chest_access;
      (rom->map).pointers = (uint16_t *)(rom->content + 0x2653);
      (rom->map).encoded = rom->content + 0x1d5d;
      (rom->map).meta = (dw_map_meta *)(rom->content + 0x1a);
      (rom->map).warps_from = (dw_warp *)(rom->content + 0xf3c8);
      (rom->map).warps_to = (dw_warp *)(rom->content + 0xf461);
      (rom->map).love_calc = (dw_love_calc *)(rom->content + 0xdf3b);
      (rom->map).return_point = (dw_return_point *)(rom->content + 0xdb01);
      (rom->map).rainbow_drop = (dw_rainbow_drop *)(rom->content + 0xde8b);
      (rom->map).rainbow_bridge = (dw_rainbow_drop *)(rom->content + 0x2c3b);
      rom->stats = (dw_stats *)(rom->content + 0x60cd);
      rom->mp_reqs = rom->content + 0x1d53;
      rom->xp_reqs = (uint16_t *)(rom->content + 0xf35b);
      rom->enemies = (dw_enemy *)(rom->content + 0x5e4b);
      rom->zones = rom->content + 0xf54f;
      rom->zone_layout = rom->content + 0xf522;
      rom->chests = (dw_chest *)(rom->content + 0x5dcd);
      rom->spike_table = (dwr_spike_table *)(rom->content + 0xcd7a);
      rom->search_table = (dwr_search_table *)(rom->content + 0xe136);
      rom->repel_table = rom->content + 0xf4fa;
      rom->weapon_shops = rom->content + 0x1991;
      rom->weapon_prices = (uint16_t *)(rom->content + 0x1947);
      rom->weapon_price_display = (uint16_t *)(rom->content + 0x7e10);
      rom->music = rom->content + 0x31af;
      rom->title_text = rom->content + 0x3f26;
      map_decode(&rom->map);
      rom_local._4_4_ = TRUE;
    }
  }
  return rom_local._4_4_;
}

Assistant:

static BOOL dwr_init(dw_rom *rom, const char *input_file, char *flags)
{
    FILE *input;
    int read;

    rom->header = malloc(ROM_SIZE);
    memset(rom->header, 0xff, ROM_SIZE);
    rom->expansion = (uint8_t*)malloc(0x10000);
    memset(rom->expansion, 0xff, 0x10000);

    input = fopen(input_file, "rb");
    if (!input) {
        fprintf(stderr, "Unable to open ROM file '%s'", input_file);
        return FALSE;
    }
    read = fread(rom->header, 1, ROM_SIZE, input);
    if (read < ROM_SIZE) {
        fprintf(stderr, "File '%s' is too small and may be corrupt, aborting.",
                input_file);
        fclose(input);
        return FALSE;
    }
    fclose(input);

    rom->content = &rom->header[0x10];
    strncpy((char *)rom->flags_encoded, flags, 24);
    rom->flags_encoded[24] = '\0'; /* Make sure it's null terminated */
    rom->map.flags = rom->flags;
    memset(rom->flags, 0, 15);
    base32_decode(rom->flags_encoded, rom->flags);
    update_flags(rom);

    rom->map.chest_access = rom->chest_access;
    /* subtract 0x9d5d from these pointers */
    rom->map.pointers = (uint16_t*)&rom->content[0x2653];
    rom->map.encoded = &rom->content[0x1d5d];
    rom->map.meta = (dw_map_meta*)&rom->content[0x1a];
    rom->map.warps_from = (dw_warp*)&rom->content[0xf3c8];
    rom->map.warps_to   = (dw_warp*)&rom->content[0xf461];
    rom->map.love_calc = (dw_love_calc*)&rom->content[0xdf3b];
    rom->map.return_point = (dw_return_point*)&rom->content[0xdb01];
    rom->map.rainbow_drop = (dw_rainbow_drop*)&rom->content[0xde8b];
    rom->map.rainbow_bridge = (dw_rainbow_drop*)&rom->content[0x2c3b];
    rom->stats = (dw_stats*)&rom->content[0x60cd];
    rom->mp_reqs = &rom->content[0x1d53];
    rom->xp_reqs = (uint16_t*)&rom->content[0xf35b];
    rom->enemies = (dw_enemy*)&rom->content[0x5e4b];
    rom->zones = &rom->content[0xf54f];
    rom->zone_layout = &rom->content[0xf522];
    rom->chests = (dw_chest*)&rom->content[0x5dcd];
    rom->spike_table = (dwr_spike_table*)&rom->content[0xcd7a];
    rom->search_table = (dwr_search_table*)&rom->content[0xe136];
    rom->repel_table = &rom->content[0xf4fa];
    rom->weapon_shops = &rom->content[0x1991];
    rom->weapon_prices = (uint16_t*)&rom->content[0x1947];
    rom->weapon_price_display = (uint16_t*)&rom->content[0x7e10];
    rom->music = &rom->content[0x31af];
    rom->title_text = &rom->content[0x3f26];

    map_decode(&rom->map);
    return TRUE;
}